

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

View<int,_true,_std::allocator<unsigned_long>_> * __thiscall
andres::View<int,_true,_std::allocator<unsigned_long>_>::boundView
          (View<int,_true,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          View<int,_true,_std::allocator<unsigned_long>_> *this,size_t dimension,size_t value)

{
  CoordinateOrder CVar1;
  pointer piVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  reference data;
  CoordinateOrder *pCVar6;
  size_t *psVar7;
  size_t *end;
  size_t *strideBegin;
  geometry_type *this_00;
  bool local_51;
  size_t local_50;
  size_t k;
  size_t j;
  allocator<int> local_2a;
  undefined1 local_29;
  size_t local_28;
  size_t value_local;
  size_t dimension_local;
  View<int,_true,_std::allocator<unsigned_long>_> *this_local;
  View<int,_true,_std::allocator<unsigned_long>_> *v;
  
  local_28 = value;
  value_local = dimension;
  dimension_local = (size_t)this;
  this_local = __return_storage_ptr__;
  testInvariant(this);
  sVar4 = value_local;
  sVar3 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(this);
  sVar5 = local_28;
  local_51 = false;
  if (sVar4 < sVar3) {
    sVar4 = shape(this,value_local);
    local_51 = sVar5 < sVar4;
  }
  marray_detail::Assert<bool>(local_51);
  sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(this);
  if (sVar5 == 1) {
    local_29 = 0;
    data = operator()(this,local_28);
    std::allocator<int>::allocator(&local_2a);
    View(__return_storage_ptr__,data,&local_2a);
    std::allocator<int>::~allocator(&local_2a);
    pCVar6 = coordinateOrder(this);
    CVar1 = *pCVar6;
    pCVar6 = marray_detail::Geometry<std::allocator<unsigned_long>_>::coordinateOrder
                       (&__return_storage_ptr__->geometry_);
    *pCVar6 = CVar1;
  }
  else {
    j._3_1_ = 0;
    std::allocator<int>::allocator((allocator<int> *)((long)&j + 2));
    View(__return_storage_ptr__,(allocator<int> *)((long)&j + 2));
    std::allocator<int>::~allocator((allocator<int> *)((long)&j + 2));
    sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(this);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::resize
              (&__return_storage_ptr__->geometry_,sVar5 - 1);
    pCVar6 = coordinateOrder(this);
    CVar1 = *pCVar6;
    pCVar6 = marray_detail::Geometry<std::allocator<unsigned_long>_>::coordinateOrder
                       (&__return_storage_ptr__->geometry_);
    *pCVar6 = CVar1;
    sVar5 = size(this);
    sVar4 = shape(this,value_local);
    psVar7 = marray_detail::Geometry<std::allocator<unsigned_long>_>::size
                       (&__return_storage_ptr__->geometry_);
    *psVar7 = sVar5 / sVar4;
    local_50 = 0;
    for (k = 0; sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(this), k < sVar5;
        k = k + 1) {
      if (k != value_local) {
        sVar5 = shape(this,k);
        psVar7 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape
                           (&__return_storage_ptr__->geometry_,local_50);
        *psVar7 = sVar5;
        sVar5 = strides(this,k);
        psVar7 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides
                           (&__return_storage_ptr__->geometry_,local_50);
        *psVar7 = sVar5;
        local_50 = local_50 + 1;
      }
    }
    this_00 = &__return_storage_ptr__->geometry_;
    psVar7 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeBegin(this_00);
    end = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeEnd(this_00);
    strideBegin = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStridesBegin
                            (this_00);
    pCVar6 = marray_detail::Geometry<std::allocator<unsigned_long>_>::coordinateOrder(this_00);
    marray_detail::stridesFromShape<unsigned_long*,unsigned_long*>(psVar7,end,strideBegin,pCVar6);
    piVar2 = this->data_;
    sVar5 = strides(this,value_local);
    __return_storage_ptr__->data_ = piVar2 + sVar5 * local_28;
    updateSimplicity(__return_storage_ptr__);
    testInvariant(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

View<T, isConst, A>
View<T, isConst, A>::boundView
(
    const std::size_t dimension,
    const std::size_t value
) const
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_ARG_TEST || (dimension < this->dimension()
        && value < shape(dimension)));
    if(this->dimension() == 1) {
        View v(&((*this)(value)));
        v.geometry_.coordinateOrder() = coordinateOrder();
        return v;
    }
    else {
        View v;
        v.geometry_.resize(this->dimension()-1);
        v.geometry_.coordinateOrder() = coordinateOrder();
        v.geometry_.size() = size() / shape(dimension);
        for(std::size_t j=0, k=0; j<this->dimension(); ++j) {
            if(j != dimension) {
                v.geometry_.shape(k) = shape(j);
                v.geometry_.strides(k) = strides(j);
                ++k;
            }
        }
        marray_detail::stridesFromShape(v.geometry_.shapeBegin(), v.geometry_.shapeEnd(),
            v.geometry_.shapeStridesBegin(), v.geometry_.coordinateOrder());
        v.data_ = data_ + strides(dimension) * value;
        v.updateSimplicity();
        v.testInvariant();
        return v;
    }
}